

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cigar.c
# Opt level: O2

char * parasail_cigar_decode(parasail_cigar_t *cigar)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char *__dest;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char tmp [40];
  
  uVar4 = (ulong)cigar->len;
  uVar5 = uVar4 << 2;
  __dest = (char *)malloc(uVar4 * 4 + 1);
  *__dest = '\0';
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    if ((int)uVar4 <= lVar7) {
      return __dest;
    }
    uVar2 = cigar->seq[lVar7] & 0xf;
    uVar4 = 0x4d;
    if (uVar2 < 10) {
      uVar4 = (ulong)(uint)(int)"MIDNSHP=XB"[uVar2];
    }
    iVar3 = snprintf(tmp,0x28,"%u%c",(ulong)(cigar->seq[lVar7] >> 4),uVar4);
    if (0x27 < iVar3) break;
    uVar6 = uVar6 + (long)iVar3;
    if (uVar5 <= uVar6) {
      lVar1 = uVar5 * 2;
      uVar5 = uVar5 * 2;
      __dest = (char *)realloc(__dest,lVar1 + 1);
    }
    strcat(__dest,tmp);
    lVar7 = lVar7 + 1;
    uVar4 = (ulong)(uint)cigar->len;
  }
  fwrite("invalid CIGAR\n",0xe,1,_stderr);
  free(__dest);
  return (char *)0x0;
}

Assistant:

char* parasail_cigar_decode(parasail_cigar_t *cigar)
{
#define SIZE 40
    char *ret = NULL;
    size_t retlen = 0;
    size_t size = 0;
    int i = 0;

    /* initial allocation for 1 op and 3 number characters per cigar int */
    size = sizeof(char)*cigar->len*4;
    ret = malloc(size+1);
    ret[0] = '\0';

    for (i=0; i<cigar->len; ++i) {
        char tmp[SIZE];
        char op = parasail_cigar_decode_op(cigar->seq[i]);
        uint32_t len = parasail_cigar_decode_len(cigar->seq[i]);
        int snprintf_retcode = snprintf(tmp, SIZE, "%u%c", len, op);
        if (snprintf_retcode >= SIZE) {
            fprintf(stderr, "invalid CIGAR\n");
            free(ret);
            return NULL;
        }
        retlen += snprintf_retcode;
        if (retlen >= size) {
            size *= 2;
            ret = realloc(ret, size+1);
        }
        strcat(ret, tmp);
    }

    return ret;
}